

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL Js::JavascriptArray::TemplatedGetItem<Js::RecyclableObject>
               (RecyclableObject *obj,uint64 index,Var *element,ScriptContext *scriptContext,
               bool checkHasItem)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  pp_Var1 = (obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
  ;
  if (((pp_Var1 == (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) ||
      (pp_Var1 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) ||
     (pp_Var1 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x101d,
                                "(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj))"
                                ,
                                "!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  JavascriptOperators::GetPropertyIdForInt(index,scriptContext,&local_38);
  if ((checkHasItem) && (BVar4 = JavascriptOperators::HasProperty(obj,local_38->pid), BVar4 == 0)) {
    return 0;
  }
  pRVar6 = (RecyclableObject *)
           JavascriptOperators::GetProperty
                     (obj,local_38->pid,scriptContext,(PropertyValueInfo *)0x0);
  *element = pRVar6;
  return (uint)(pRVar6 !=
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr);
}

Assistant:

BOOL JavascriptArray::TemplatedGetItem(RecyclableObject * obj, uint64 index, Var * element, ScriptContext * scriptContext, bool checkHasItem)
    {
        // Note: Sometime cross site array go down this path to get the marshalling
        Assert(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(obj)
            && !VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(obj)
            && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(obj));
        PropertyRecord const * propertyRecord;
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);

        if (checkHasItem && !JavascriptOperators::HasProperty(obj, propertyRecord->GetPropertyId()))
        {
            return FALSE;
        }

        *element = JavascriptOperators::GetProperty(obj, propertyRecord->GetPropertyId(), scriptContext);
        return *element != scriptContext->GetLibrary()->GetUndefined();
    }